

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

HighsStatus __thiscall Highs::multiobjectiveSolve(Highs *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  pair<int,_int> pVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  pointer pdVar5;
  _Alloc_hider _Var6;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __first;
  iterator __last;
  _Alloc_hider _Var7;
  bool bVar8;
  HighsStatus HVar9;
  pointer *ppdVar10;
  stringstream *psVar11;
  stringstream *psVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  pointer pHVar16;
  pointer __old_p_3;
  char *pcVar17;
  HighsInt iCol;
  long lVar18;
  long lVar19;
  int iVar20;
  pointer __old_p;
  Highs *pHVar21;
  ulong uVar22;
  double dVar23;
  bool feasible;
  bool integral;
  bool valid;
  HighsSolution solution;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> priority_objective;
  vector<double,_std::allocator<double>_> value;
  vector<int,_std::allocator<int>_> index;
  bool local_1b2;
  bool local_1b1;
  string local_1b0;
  HighsLp *local_190;
  bool local_185;
  HighsStatus local_184;
  HighsLogOptions *local_180;
  HighsInt local_174;
  Highs *local_170;
  double local_168;
  undefined8 uStack_160;
  vector<double,_std::allocator<double>_> *local_158;
  uint local_14c;
  undefined1 local_148 [32];
  pointer pdStack_128;
  pointer local_120;
  pointer pdStack_118;
  pointer local_110;
  pointer pdStack_108;
  pointer local_100;
  pointer pdStack_f8;
  pointer local_f0;
  pointer pdStack_e8;
  double local_e0;
  ulong local_d8;
  ulong local_d0;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_c8;
  iterator iStack_c0;
  pair<int,_int> *local_b8;
  long local_b0;
  vector<double,_std::allocator<double>_> *local_a8;
  vector<double,_std::allocator<double>_> local_a0;
  vector<int,_std::allocator<int>_> local_88;
  string local_70;
  string local_50;
  
  pHVar16 = (this->multi_linear_objective_).
            super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar15 = (ulong)((long)(this->multi_linear_objective_).
                         super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar16) >> 6;
  local_190 = &(this->model_).lp_;
  uVar14 = (uint)uVar15;
  if (0 < (int)uVar14) {
    ppdVar10 = (pointer *)
               ((long)&(pHVar16->coefficients).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl + 8);
    uVar13 = 0;
    do {
      if ((long)*ppdVar10 - (long)((_Vector_impl_data *)(ppdVar10 + -1))->_M_start >> 3 !=
          (long)(((HighsModel *)local_190)->lp_).num_col_) {
        highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                     "Multiple linear objective coefficient vector %d has size incompatible with model\n"
                    );
        return kError;
      }
      uVar13 = uVar13 + 1;
      ppdVar10 = ppdVar10 + 8;
    } while ((uVar14 & 0x7fffffff) != uVar13);
  }
  local_180 = &(this->options_).super_HighsOptionsStruct.log_options;
  pcVar17 = "using lexicographic optimization by priority";
  if ((this->options_).super_HighsOptionsStruct.blend_multi_objectives != false) {
    pcVar17 = "blending objectives by weight";
  }
  highsLogUser(local_180,kInfo,"Solving with %d multiple linear objectives, %s\n",
               uVar15 & 0xffffffff,pcVar17);
  highsLogUser(local_180,kInfo,"Ix      weight      offset     abs_tol     rel_tol    priority%s\n")
  ;
  local_170 = this;
  local_d0 = uVar15;
  if ((int)uVar14 < 1) {
    psVar11 = (stringstream *)0x0;
  }
  else {
    local_158 = (vector<double,_std::allocator<double>_> *)(ulong)(uVar14 & 0x7fffffff);
    uVar15 = 0;
    psVar12 = (stringstream *)0x0;
    do {
      pHVar16 = (this->multi_linear_objective_).
                super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>.
                _M_impl.super__Vector_impl_data._M_start + uVar15;
      psVar11 = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(psVar11);
      if (psVar12 != (stringstream *)0x0) {
        (**(code **)(*(long *)psVar12 + 8))(psVar12);
      }
      highsFormatToString_abi_cxx11_
                ((string *)local_148,"%2d %11.6g %11.6g %11.6g %11.6g %11d  ",pHVar16->weight,
                 pHVar16->offset,pHVar16->abs_tolerance,pHVar16->rel_tolerance,uVar15 & 0xffffffff,
                 (ulong)(uint)pHVar16->priority);
      psVar12 = psVar11 + 0x10;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)psVar12,(char *)local_148._0_8_,local_148._8_8_);
      if (local_148._0_8_ != (long)local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_);
      }
      if (((HighsLp *)&local_190->num_col_)->num_col_ - 1U < 9) {
        uVar13 = 0;
        do {
          pcVar17 = ",";
          if (uVar13 == 0) {
            pcVar17 = "";
          }
          highsFormatToString_abi_cxx11_
                    ((string *)local_148,"%s c_{%1d} = %g",
                     *(undefined8 *)
                      (*(long *)&(pHVar16->coefficients).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + uVar13 * 8),pcVar17,uVar13 & 0xffffffff);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)psVar12,(char *)local_148._0_8_,local_148._8_8_);
          if (local_148._0_8_ != (long)local_148 + 0x10) {
            operator_delete((void *)local_148._0_8_);
          }
          uVar13 = uVar13 + 1;
        } while ((long)uVar13 < (long)((HighsLp *)&local_190->num_col_)->num_col_);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar12,"\n",1);
      std::__cxx11::stringbuf::str();
      this = local_170;
      highsLogUser(local_180,kInfo,"%s");
      if (local_148._0_8_ != (long)local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_);
      }
      uVar15 = uVar15 + 1;
      psVar12 = psVar11;
    } while ((vector<double,_std::allocator<double>_> *)uVar15 != local_158);
  }
  clearSolver(this);
  uVar14 = (uint)local_d0;
  if ((this->options_).super_HighsOptionsStruct.blend_multi_objectives == true) {
    (this->model_).lp_.offset_ = 0.0;
    this_00 = &(this->model_).lp_.col_cost_;
    local_148._0_4_ = 0;
    local_148._4_4_ = 0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (this_00,(long)(this->model_).lp_.num_col_,(value_type_conflict1 *)local_148);
    if (0 < (int)uVar14) {
      pHVar16 = (this->multi_linear_objective_).
                super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar4 = (this->model_).lp_.num_col_;
      pdVar5 = (this->model_).lp_.col_cost_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar15 = 0;
      do {
        (this->model_).lp_.offset_ =
             pHVar16[uVar15].weight * pHVar16[uVar15].offset + (this->model_).lp_.offset_;
        if (0 < (int)uVar4) {
          lVar18 = *(long *)&pHVar16[uVar15].coefficients.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data;
          uVar13 = 0;
          do {
            pdVar5[uVar13] =
                 pHVar16[uVar15].weight * *(double *)(lVar18 + uVar13 * 8) + pdVar5[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar4 != uVar13);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != (uVar14 & 0x7fffffff));
    }
    (this->model_).lp_.sense_ = kMinimize;
    psVar12 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar12);
    if (psVar11 != (stringstream *)0x0) {
      (**(code **)(*(long *)psVar11 + 8))(psVar11);
    }
    highsFormatToString_abi_cxx11_((string *)local_148,"Solving with blended objective");
    psVar11 = psVar12 + 0x10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)psVar11,(char *)local_148._0_8_,local_148._8_8_);
    pVar1 = (pair<int,_int>)((long)local_148 + 0x10);
    if ((pair<int,_int>)local_148._0_8_ != pVar1) {
      operator_delete((void *)local_148._0_8_);
    }
    if (((HighsLp *)&local_190->num_col_)->num_col_ < 10) {
      pcVar17 = "max";
      if ((local_170->model_).lp_.sense_ == kMinimize) {
        pcVar17 = "min";
      }
      highsFormatToString_abi_cxx11_
                ((string *)local_148,": %s %g",(local_170->model_).lp_.offset_,pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)psVar11,(char *)local_148._0_8_,local_148._8_8_);
      if ((pair<int,_int>)local_148._0_8_ != pVar1) {
        operator_delete((void *)local_148._0_8_);
      }
      if (0 < ((HighsLp *)&local_190->num_col_)->num_col_) {
        uVar15 = 0;
        do {
          highsFormatToString_abi_cxx11_
                    ((string *)local_148," + (%g) x[%d]",
                     (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar15],uVar15 & 0xffffffff);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)psVar11,(char *)local_148._0_8_,local_148._8_8_);
          if ((pair<int,_int>)local_148._0_8_ != pVar1) {
            operator_delete((void *)local_148._0_8_);
          }
          uVar15 = uVar15 + 1;
        } while ((long)uVar15 < (long)((HighsLp *)&local_190->num_col_)->num_col_);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar11,"\n",1);
    pHVar21 = local_170;
    std::__cxx11::stringbuf::str();
    highsLogUser(local_180,kInfo,"%s",local_148._0_8_);
    if ((pair<int,_int>)local_148._0_8_ != pVar1) {
      operator_delete((void *)local_148._0_8_);
    }
    HVar9 = solve(pHVar21);
    psVar11 = psVar12;
  }
  else {
    if (((int)uVar14 < 2) || ((this->model_).hessian_.dim_ == 0)) {
      bVar8 = hasRepeatedLinearObjectivePriorities(this,(HighsLinearObjective *)0x0);
      if (!bVar8) {
        local_d8 = 0xffffffff;
        local_c8._M_current = (pair<int,_int> *)0x0;
        iStack_c0._M_current = (pair<int,_int> *)0x0;
        local_b8 = (pair<int,_int> *)0x0;
        if (0 < (int)uVar14) {
          uVar15 = (ulong)(uVar14 & 0x7fffffff);
          lVar18 = 0x38;
          lVar19 = 0;
          do {
            local_148._0_8_ =
                 (ulong)*(uint *)((long)&((local_170->multi_linear_objective_).
                                          super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->weight +
                                 lVar18) + lVar19;
            if (iStack_c0._M_current == local_b8) {
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_c8,
                         iStack_c0,(pair<int,_int> *)local_148);
            }
            else {
              *iStack_c0._M_current = (pair<int,_int>)local_148._0_8_;
              iStack_c0._M_current = iStack_c0._M_current + 1;
            }
            lVar19 = lVar19 + 0x100000000;
            lVar18 = lVar18 + 0x40;
            uVar15 = uVar15 - 1;
          } while (uVar15 != 0);
        }
        __last._M_current = iStack_c0._M_current;
        __first._M_current = local_c8._M_current;
        if (local_c8._M_current != iStack_c0._M_current) {
          uVar15 = (long)iStack_c0._M_current - (long)local_c8._M_current >> 3;
          lVar18 = 0x3f;
          if (uVar15 != 0) {
            for (; uVar15 >> lVar18 == 0; lVar18 = lVar18 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<int,int>,std::pair<int,int>)>>
                    (local_c8,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                               )iStack_c0._M_current,(ulong)(((uint)lVar18 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<bool_(*)(std::pair<int,_int>,_std::pair<int,_int>)>)0x23e125);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<int,int>,std::pair<int,int>)>>
                    (__first,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                              )__last._M_current,
                     (_Iter_comp_iter<bool_(*)(std::pair<int,_int>,_std::pair<int,_int>)>)0x23e125);
        }
        pHVar21 = local_170;
        (local_170->model_).lp_.offset_ = 0.0;
        local_158 = &(local_170->model_).lp_.col_cost_;
        local_148._0_4_ = 0;
        local_148._4_4_ = 0;
        std::vector<double,_std::allocator<double>_>::_M_fill_assign
                  (local_158,(long)(local_170->model_).lp_.num_col_,
                   (value_type_conflict1 *)local_148);
        local_174 = (pHVar21->model_).lp_.num_row_;
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_88,(long)(pHVar21->model_).lp_.num_col_,(allocator_type *)local_148);
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_a0,(long)((HighsLp *)&local_190->num_col_)->num_col_,
                   (allocator_type *)local_148);
        local_148._0_8_ = local_148._0_8_ & 0xffffffffffff0000;
        local_148._8_8_ = (pointer)0x0;
        local_148._16_8_ = 0;
        local_148._24_8_ = 0;
        pdStack_128 = (pointer)0x0;
        local_120 = (pointer)0x0;
        pdStack_118 = (pointer)0x0;
        local_110 = (pointer)0x0;
        pdStack_108 = (pointer)0x0;
        local_100 = (pointer)0x0;
        pdStack_f8 = (pointer)0x0;
        local_f0 = (pointer)0x0;
        pdStack_e8 = (pointer)0x0;
        if ((int)uVar14 < 1) {
          local_184 = kError;
          bVar8 = true;
        }
        else {
          local_d8 = (ulong)((int)local_d8 + uVar14);
          local_a8 = &(pHVar21->solution_).col_value;
          local_d0 = (ulong)(uVar14 & 0x7fffffff);
          local_184 = kError;
          uVar15 = 0;
          do {
            local_14c = local_c8._M_current[uVar15].first;
            lVar18 = (long)local_c8._M_current[uVar15].second;
            pHVar16 = (pHVar21->multi_linear_objective_).
                      super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            (pHVar21->model_).lp_.offset_ = pHVar16[lVar18].offset;
            local_b0 = lVar18;
            std::vector<double,_std::allocator<double>_>::operator=
                      (local_158,&pHVar16[lVar18].coefficients);
            pHVar16 = pHVar16 + lVar18;
            bVar8 = 0.0 < pHVar16->weight;
            (pHVar21->model_).lp_.sense_ = (bVar8 - 1) + (uint)bVar8;
            bVar8 = HighsLp::isMip(local_190);
            if ((bVar8) && (local_148[0] == (allocator_type)0x1)) {
              HVar9 = setSolution(pHVar21,(HighsSolution *)local_148);
              if (HVar9 == kError) {
                highsLogUser(local_180,kError,
                             "Failure to use one MIP to provide an integer feasible solution of the next\n"
                            );
                local_184 = kError;
                returnFromLexicographicOptimization(pHVar21,kError,local_174);
              }
              else {
                assessPrimalSolution(pHVar21,&local_185,&local_1b1,&local_1b2);
                if (((local_185 != true) || (local_1b1 != true)) || (local_1b2 == false)) {
                  highsBoolToString_abi_cxx11_(&local_1b0,local_185,2);
                  _Var6._M_p = local_1b0._M_dataplus._M_p;
                  highsBoolToString_abi_cxx11_(&local_50,local_1b1,2);
                  _Var7._M_p = local_50._M_dataplus._M_p;
                  highsBoolToString_abi_cxx11_(&local_70,local_1b2,2);
                  highsLogUser(local_180,kWarning,
                               "Failure to use one MIP to provide an integer feasible solution of the next: status is valid = %s, integral = %s, feasible = %s\n"
                               ,_Var6._M_p,_Var7._M_p,local_70._M_dataplus._M_p);
                  pHVar21 = local_170;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_70._M_dataplus._M_p != &local_70.field_2) {
                    operator_delete(local_70._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_50._M_dataplus._M_p != &local_50.field_2) {
                    operator_delete(local_50._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                    operator_delete(local_1b0._M_dataplus._M_p);
                  }
                }
              }
              if (HVar9 != kError) goto LAB_0023d790;
              iVar20 = 1;
              bVar8 = false;
            }
            else {
LAB_0023d790:
              psVar12 = (stringstream *)operator_new(0x188);
              std::__cxx11::stringstream::stringstream(psVar12);
              if (psVar11 != (stringstream *)0x0) {
                (**(code **)(*(long *)psVar11 + 8))(psVar11);
              }
              highsFormatToString_abi_cxx11_(&local_1b0,"Solving with objective %d",local_b0);
              psVar11 = psVar12 + 0x10;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar11,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                operator_delete(local_1b0._M_dataplus._M_p);
              }
              if (((HighsLp *)&local_190->num_col_)->num_col_ < 10) {
                pcVar17 = "max";
                if ((pHVar21->model_).lp_.sense_ == kMinimize) {
                  pcVar17 = "min";
                }
                highsFormatToString_abi_cxx11_
                          (&local_1b0,": %s %g",(pHVar21->model_).lp_.offset_,pcVar17);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)psVar11,local_1b0._M_dataplus._M_p,local_1b0._M_string_length)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                  operator_delete(local_1b0._M_dataplus._M_p);
                }
                if (0 < ((HighsLp *)&local_190->num_col_)->num_col_) {
                  uVar13 = 0;
                  do {
                    highsFormatToString_abi_cxx11_
                              (&local_1b0," + (%g) x[%d]",
                               (local_158->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data._M_start[uVar13],uVar13 & 0xffffffff)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)psVar11,local_1b0._M_dataplus._M_p,
                               local_1b0._M_string_length);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                      operator_delete(local_1b0._M_dataplus._M_p);
                    }
                    uVar13 = uVar13 + 1;
                  } while ((long)uVar13 < (long)((HighsLp *)&local_190->num_col_)->num_col_);
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar11,"\n",1);
              std::__cxx11::stringbuf::str();
              highsLogUser(local_180,kInfo,"%s",local_1b0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                operator_delete(local_1b0._M_dataplus._M_p);
              }
              HVar9 = solve(pHVar21);
              psVar11 = psVar12;
              if (HVar9 == kError) {
                local_184 = kError;
                returnFromLexicographicOptimization(pHVar21,kError,local_174);
                iVar20 = 1;
LAB_0023d974:
                bVar8 = false;
              }
              else if (pHVar21->model_status_ == kOptimal) {
                if (uVar15 == local_d8) {
                  iVar20 = 0x17;
                  goto LAB_0023d974;
                }
                bVar8 = HighsLp::isMip(local_190);
                if (bVar8) {
                  std::vector<double,_std::allocator<double>_>::operator=
                            ((vector<double,_std::allocator<double>_> *)(local_148 + 8),local_a8);
                  local_148[0] = (allocator_type)0x1;
                }
                if (((HighsLp *)&local_190->num_col_)->num_col_ < 1) {
                  uVar13 = 0;
                }
                else {
                  pdVar5 = (local_158->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  lVar18 = 0;
                  uVar13 = 0;
                  do {
                    dVar2 = pdVar5[lVar18];
                    if ((dVar2 != 0.0) || (NAN(dVar2))) {
                      iVar20 = (int)uVar13;
                      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar20] = (HighsInt)lVar18;
                      local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar20] = dVar2;
                      uVar13 = (ulong)(iVar20 + 1);
                    }
                    lVar18 = lVar18 + 1;
                  } while (lVar18 < ((HighsLp *)&local_190->num_col_)->num_col_);
                }
                dVar2 = (pHVar21->info_).super_HighsInfoStruct.objective_function_value;
                dVar3 = pHVar16->abs_tolerance;
                dVar23 = pHVar16->rel_tolerance;
                uVar22 = -(ulong)(dVar3 < 0.0);
                if ((pHVar21->model_).lp_.sense_ == kMinimize) {
                  local_168 = (double)(uVar22 & 0x7ff0000000000000 |
                                      ~uVar22 & (ulong)(dVar3 + dVar2));
                  if (0.0 <= dVar23) {
                    if (0.0 <= dVar2) {
                      dVar23 = dVar23 + 1.0;
                    }
                    else {
                      if (0.0 <= dVar2) goto LAB_0023db4a;
                      dVar23 = 1.0 - dVar23;
                    }
                    if (dVar2 * dVar23 <= local_168) {
                      local_168 = dVar2 * dVar23;
                    }
                  }
LAB_0023db4a:
                  local_168 = local_168 - (pHVar21->model_).lp_.offset_;
                  local_e0 = -INFINITY;
                }
                else {
                  local_e0 = (double)(uVar22 & 0xfff0000000000000 | ~uVar22 & (ulong)(dVar2 - dVar3)
                                     );
                  if (0.0 <= dVar23) {
                    if (0.0 <= dVar2) {
                      dVar23 = 1.0 - dVar23;
                    }
                    else {
                      if (0.0 <= dVar2) goto LAB_0023db81;
                      dVar23 = dVar23 + 1.0;
                    }
                    if (local_e0 <= dVar2 * dVar23) {
                      local_e0 = dVar2 * dVar23;
                    }
                  }
LAB_0023db81:
                  local_e0 = local_e0 - (pHVar21->model_).lp_.offset_;
                  local_168 = INFINITY;
                }
                uStack_160 = 0;
                if ((local_e0 <= -INFINITY) && (INFINITY <= local_168)) {
                  highsLogUser(local_180,kWarning,
                               "After priority %d solve, no objective constraint due to absolute tolerance being %g < 0, and relative tolerance being %g < 0\n"
                               ,pHVar16->abs_tolerance,pHVar16->rel_tolerance,(ulong)local_14c);
                }
                psVar11 = (stringstream *)operator_new(0x188);
                std::__cxx11::stringstream::stringstream(psVar11);
                (**(code **)(*(long *)psVar12 + 8))(psVar12);
                highsFormatToString_abi_cxx11_
                          (&local_1b0,"Add constraint for objective %d: ",local_b0);
                psVar12 = psVar11 + 0x10;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)psVar12,local_1b0._M_dataplus._M_p,local_1b0._M_string_length)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                  operator_delete(local_1b0._M_dataplus._M_p);
                }
                iVar20 = (int)uVar13;
                if (iVar20 < 10) {
                  highsFormatToString_abi_cxx11_(&local_1b0,"%g <= ",local_e0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)psVar12,local_1b0._M_dataplus._M_p,
                             local_1b0._M_string_length);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                    operator_delete(local_1b0._M_dataplus._M_p);
                  }
                  if (0 < iVar20) {
                    uVar22 = 0;
                    do {
                      pcVar17 = " + ";
                      if (uVar22 == 0) {
                        pcVar17 = "";
                      }
                      highsFormatToString_abi_cxx11_
                                (&local_1b0,"%s(%g) x[%d]",
                                 local_a0.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar22],pcVar17,
                                 (ulong)(uint)local_88.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar22]);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)psVar12,local_1b0._M_dataplus._M_p,
                                 local_1b0._M_string_length);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                        operator_delete(local_1b0._M_dataplus._M_p);
                      }
                      uVar22 = uVar22 + 1;
                    } while (uVar13 != uVar22);
                  }
                  highsFormatToString_abi_cxx11_(&local_1b0," <= %g\n",local_168);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)psVar12,local_1b0._M_dataplus._M_p,
                             local_1b0._M_string_length);
                  pHVar21 = local_170;
                }
                else {
                  highsFormatToString_abi_cxx11_(&local_1b0,"Bounds [%g, %g]\n",local_e0,local_168);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)psVar12,local_1b0._M_dataplus._M_p,
                             local_1b0._M_string_length);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                  operator_delete(local_1b0._M_dataplus._M_p);
                }
                std::__cxx11::stringbuf::str();
                highsLogUser(local_180,kInfo,"%s",local_1b0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                  operator_delete(local_1b0._M_dataplus._M_p);
                }
                addRow(pHVar21,local_e0,local_168,iVar20,
                       local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
                iVar20 = 0;
                bVar8 = true;
              }
              else {
                modelStatusToString_abi_cxx11_(&local_1b0,pHVar21,pHVar21->model_status_);
                highsLogUser(local_180,kWarning,"After priority %d solve, model status is %s\n",
                             (ulong)local_14c,local_1b0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                  operator_delete(local_1b0._M_dataplus._M_p);
                }
                iVar20 = 1;
                returnFromLexicographicOptimization(pHVar21,kWarning,local_174);
                bVar8 = false;
                local_184 = kWarning;
              }
            }
            if (!bVar8) goto LAB_0023de24;
            uVar15 = uVar15 + 1;
          } while (uVar15 != local_d0);
          iVar20 = 0x17;
LAB_0023de24:
          bVar8 = iVar20 == 0x17;
        }
        if (bVar8) {
          local_184 = kOk;
          returnFromLexicographicOptimization(pHVar21,kOk,local_174);
        }
        if (pdStack_f8 != (pointer)0x0) {
          operator_delete(pdStack_f8);
        }
        HVar9 = local_184;
        if (local_110 != (pointer)0x0) {
          operator_delete(local_110);
        }
        if (pdStack_128 != (pointer)0x0) {
          operator_delete(pdStack_128);
        }
        if ((pointer)local_148._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_148._8_8_);
        }
        if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (HighsInt *)0x0) {
          operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_c8._M_current != (pair<int,_int> *)0x0) {
          operator_delete(local_c8._M_current);
        }
        goto LAB_0023ded5;
      }
      pcVar17 = "Repeated priorities for lexicographic optimization is illegal\n";
    }
    else {
      pcVar17 = "Cannot perform non-trivial lexicographic optimization for QP\n";
    }
    HVar9 = kError;
    highsLogUser(local_180,kError,pcVar17);
  }
LAB_0023ded5:
  if (psVar11 != (stringstream *)0x0) {
    (**(code **)(*(long *)psVar11 + 8))();
  }
  return HVar9;
}

Assistant:

HighsStatus Highs::multiobjectiveSolve() {
  const HighsInt coeff_logging_size_limit = 10;
  HighsInt num_linear_objective = this->multi_linear_objective_.size();

  assert(num_linear_objective > 0);
  HighsLp& lp = this->model_.lp_;
  for (HighsInt iObj = 0; iObj < num_linear_objective; iObj++) {
    HighsLinearObjective& multi_linear_objective =
        this->multi_linear_objective_[iObj];
    if (multi_linear_objective.coefficients.size() !=
        static_cast<size_t>(lp.num_col_)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "Multiple linear objective coefficient vector %d has size "
                   "incompatible with model\n",
                   int(iObj));
      return HighsStatus::kError;
    }
  }

  std::unique_ptr<std::stringstream> multi_objective_log;
  highsLogUser(options_.log_options, HighsLogType::kInfo,
               "Solving with %d multiple linear objectives, %s\n",
               int(num_linear_objective),
               this->options_.blend_multi_objectives
                   ? "blending objectives by weight"
                   : "using lexicographic optimization by priority");
  highsLogUser(
      options_.log_options, HighsLogType::kInfo,
      "Ix      weight      offset     abs_tol     rel_tol    priority%s\n",
      lp.num_col_ < coeff_logging_size_limit ? "   coefficients" : "");
  for (HighsInt iObj = 0; iObj < num_linear_objective; iObj++) {
    HighsLinearObjective& linear_objective =
        this->multi_linear_objective_[iObj];
    multi_objective_log =
        std::unique_ptr<std::stringstream>(new std::stringstream());
    *multi_objective_log << highsFormatToString(
        "%2d %11.6g %11.6g %11.6g %11.6g %11d  ", int(iObj),
        linear_objective.weight, linear_objective.offset,
        linear_objective.abs_tolerance, linear_objective.rel_tolerance,
        linear_objective.priority);
    if (lp.num_col_ < coeff_logging_size_limit) {
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
        *multi_objective_log << highsFormatToString(
            "%s c_{%1d} = %g", iCol == 0 ? "" : ",", int(iCol),
            linear_objective.coefficients[iCol]);
    }
    *multi_objective_log << "\n";
    highsLogUser(options_.log_options, HighsLogType::kInfo, "%s",
                 multi_objective_log->str().c_str());
  }
  this->clearSolver();
  if (this->options_.blend_multi_objectives) {
    // Objectives are blended by weight and minimized
    lp.offset_ = 0;
    lp.col_cost_.assign(lp.num_col_, 0);
    for (HighsInt iObj = 0; iObj < num_linear_objective; iObj++) {
      HighsLinearObjective& multi_linear_objective =
          this->multi_linear_objective_[iObj];
      lp.offset_ +=
          multi_linear_objective.weight * multi_linear_objective.offset;
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
        lp.col_cost_[iCol] += multi_linear_objective.weight *
                              multi_linear_objective.coefficients[iCol];
    }
    lp.sense_ = ObjSense::kMinimize;

    multi_objective_log =
        std::unique_ptr<std::stringstream>(new std::stringstream());
    *multi_objective_log << highsFormatToString(
        "Solving with blended objective");
    if (lp.num_col_ < coeff_logging_size_limit) {
      *multi_objective_log << highsFormatToString(
          ": %s %g", lp.sense_ == ObjSense::kMinimize ? "min" : "max",
          lp.offset_);
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
        *multi_objective_log << highsFormatToString(
            " + (%g) x[%d]", lp.col_cost_[iCol], int(iCol));
    }
    *multi_objective_log << "\n";
    highsLogUser(options_.log_options, HighsLogType::kInfo, "%s",
                 multi_objective_log->str().c_str());
    return this->solve();
  }

  // Objectives are applied lexicographically
  if (model_.isQp() && num_linear_objective > 1) {
    // Lexicographic optimization with a single linear objective is
    // trivially standard optimization, so is OK
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Cannot perform non-trivial lexicographic optimization for QP\n");
    return HighsStatus::kError;
  }
  // Check whether there are repeated linear objective priorities
  if (hasRepeatedLinearObjectivePriorities()) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Repeated priorities for lexicographic optimization is illegal\n");
    return HighsStatus::kError;
  }
  std::vector<std::pair<HighsInt, HighsInt>> priority_objective;

  for (HighsInt iObj = 0; iObj < num_linear_objective; iObj++)
    priority_objective.push_back(
        std::make_pair(this->multi_linear_objective_[iObj].priority, iObj));
  std::sort(priority_objective.begin(), priority_objective.end(), comparison);
  // Clear LP objective
  lp.offset_ = 0;
  lp.col_cost_.assign(lp.num_col_, 0);
  const HighsInt original_lp_num_row = lp.num_row_;
  std::vector<HighsInt> index(lp.num_col_);
  std::vector<double> value(lp.num_col_);
  // Use the solution of one MIP to provide an integer feasible
  // solution of the next
  HighsSolution solution;
  for (HighsInt iIx = 0; iIx < num_linear_objective; iIx++) {
    HighsInt priority = priority_objective[iIx].first;
    HighsInt iObj = priority_objective[iIx].second;
    // Use this objective
    HighsLinearObjective& linear_objective =
        this->multi_linear_objective_[iObj];
    lp.offset_ = linear_objective.offset;
    lp.col_cost_ = linear_objective.coefficients;
    lp.sense_ =
        linear_objective.weight > 0 ? ObjSense::kMinimize : ObjSense::kMaximize;
    if (lp.isMip() && solution.value_valid) {
      HighsStatus set_solution_status = this->setSolution(solution);
      if (set_solution_status == HighsStatus::kError) {
        highsLogUser(options_.log_options, HighsLogType::kError,
                     "Failure to use one MIP to provide an integer feasible "
                     "solution of the next\n");
        return returnFromLexicographicOptimization(HighsStatus::kError,
                                                   original_lp_num_row);
      }
      bool valid, integral, feasible;
      HighsStatus assess_primal_solution =
          assessPrimalSolution(valid, integral, feasible);
      if (!valid || !integral || !feasible) {
        highsLogUser(options_.log_options, HighsLogType::kWarning,
                     "Failure to use one MIP to provide an integer feasible "
                     "solution of the next: "
                     "status is valid = %s, integral = %s, feasible = %s\n",
                     highsBoolToString(valid).c_str(),
                     highsBoolToString(integral).c_str(),
                     highsBoolToString(feasible).c_str());
      }
    }
    multi_objective_log =
        std::unique_ptr<std::stringstream>(new std::stringstream());
    *multi_objective_log << highsFormatToString("Solving with objective %d",
                                                int(iObj));
    if (lp.num_col_ < coeff_logging_size_limit) {
      *multi_objective_log << highsFormatToString(
          ": %s %g", lp.sense_ == ObjSense::kMinimize ? "min" : "max",
          lp.offset_);
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
        *multi_objective_log << highsFormatToString(
            " + (%g) x[%d]", lp.col_cost_[iCol], int(iCol));
    }
    *multi_objective_log << "\n";
    highsLogUser(options_.log_options, HighsLogType::kInfo, "%s",
                 multi_objective_log->str().c_str());
    HighsStatus solve_status = this->solve();
    if (solve_status == HighsStatus::kError)
      return returnFromLexicographicOptimization(HighsStatus::kError,
                                                 original_lp_num_row);
    if (model_status_ != HighsModelStatus::kOptimal) {
      highsLogUser(options_.log_options, HighsLogType::kWarning,
                   "After priority %d solve, model status is %s\n",
                   int(priority), modelStatusToString(model_status_).c_str());
      return returnFromLexicographicOptimization(HighsStatus::kWarning,
                                                 original_lp_num_row);
    }
    if (iIx == num_linear_objective - 1) break;
    if (lp.isMip()) {
      // Save the solution to provide an integer feasible solution of
      // the next MIP
      solution.col_value = this->solution_.col_value;
      solution.value_valid = true;
    }
    // Add the constraint
    HighsInt nnz = 0;
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      if (lp.col_cost_[iCol]) {
        index[nnz] = iCol;
        value[nnz] = lp.col_cost_[iCol];
        nnz++;
      }
    }
    double objective = info_.objective_function_value;
    HighsStatus add_row_status;
    double lower_bound = -kHighsInf;
    double upper_bound = kHighsInf;
    if (lp.sense_ == ObjSense::kMinimize) {
      // Minimizing, so set a greater upper bound than the objective
      if (linear_objective.abs_tolerance >= 0)
        upper_bound = objective + linear_objective.abs_tolerance;
      if (linear_objective.rel_tolerance >= 0) {
        if (objective >= 0) {
          // Guarantees objective of at least (1+t).f^*
          //
          // so ((1+t).f^*-f^*)/f^* = t
          upper_bound = std::min(
              objective * (1.0 + linear_objective.rel_tolerance), upper_bound);
        } else if (objective < 0) {
          // Guarantees objective of at least (1-t).f^*
          //
          // so ((1-t).f^*-f^*)/f^* = -t
          upper_bound = std::min(
              objective * (1.0 - linear_objective.rel_tolerance), upper_bound);
        }
      }
      upper_bound -= lp.offset_;
    } else {
      // Maximizing, so set a lesser lower bound than the objective
      if (linear_objective.abs_tolerance >= 0)
        lower_bound = objective - linear_objective.abs_tolerance;
      if (linear_objective.rel_tolerance >= 0) {
        if (objective >= 0) {
          // Guarantees objective of at most (1-t).f^*
          //
          // so ((1-t).f^*-f^*)/f^* = -t
          lower_bound = std::max(
              objective * (1.0 - linear_objective.rel_tolerance), lower_bound);
        } else if (objective < 0) {
          // Guarantees objective of at least (1+t).f^*
          //
          // so ((1+t).f^*-f^*)/f^* = t
          lower_bound = std::max(
              objective * (1.0 + linear_objective.rel_tolerance), lower_bound);
        }
      }
      lower_bound -= lp.offset_;
    }
    if (lower_bound == -kHighsInf && upper_bound == kHighsInf)
      highsLogUser(options_.log_options, HighsLogType::kWarning,
                   "After priority %d solve, no objective constraint due to "
                   "absolute tolerance being %g < 0,"
                   " and relative tolerance being %g < 0\n",
                   int(priority), linear_objective.abs_tolerance,
                   linear_objective.rel_tolerance);
    multi_objective_log =
        std::unique_ptr<std::stringstream>(new std::stringstream());
    *multi_objective_log << highsFormatToString(
        "Add constraint for objective %d: ", int(iObj));
    if (nnz < coeff_logging_size_limit) {
      *multi_objective_log << highsFormatToString("%g <= ", lower_bound);
      for (HighsInt iEl = 0; iEl < nnz; iEl++)
        *multi_objective_log << highsFormatToString(
            "%s(%g) x[%d]", iEl > 0 ? " + " : "", value[iEl], int(index[iEl]));
      *multi_objective_log << highsFormatToString(" <= %g\n", upper_bound);
    } else {
      *multi_objective_log << highsFormatToString("Bounds [%g, %g]\n",
                                                  lower_bound, upper_bound);
    }
    highsLogUser(options_.log_options, HighsLogType::kInfo, "%s",
                 multi_objective_log->str().c_str());
    add_row_status =
        this->addRow(lower_bound, upper_bound, nnz, index.data(), value.data());
    assert(add_row_status == HighsStatus::kOk);
  }
  return returnFromLexicographicOptimization(HighsStatus::kOk,
                                             original_lp_num_row);
}